

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
::erase(btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
        *this,iterator iter)

{
  size_type *psVar1;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar2;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar3;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
  this_00;
  uint uVar4;
  bool bVar5;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar6;
  bool bVar7;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar8;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *right;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar9;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
  _Var10;
  ushort uVar11;
  uint uVar12;
  char *__function;
  short sVar13;
  allocator_type *paVar14;
  uint uVar15;
  node_type *right_00;
  iterator iVar16;
  uint local_5c;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *local_58;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_50;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_40;
  
  paVar14 = iter._8_8_;
  pbVar9 = iter.node;
  uVar15 = iter.position;
  local_40.node = pbVar9;
  local_40.position = uVar15;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    bVar2 = pbVar9[0xb];
    if (bVar2 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::operator--(&local_40);
      if (((ulong)local_40.node & 7) != 0) goto LAB_001c9bb8;
      if (local_40.node[0xb] ==
          (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
           )0x0) {
        __assert_fail("iter.node->leaf()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xa7e,
                      "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::erase(iterator) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                     );
      }
      paVar14 = (allocator_type *)
                (ulong)*(uint *)(local_40.node + (long)local_40.position * 4 + 0xc);
      *(uint *)(pbVar9 + (long)(int)uVar15 * 4 + 0xc) =
           *(uint *)(local_40.node + (long)local_40.position * 4 + 0xc);
    }
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
    ::remove_value(local_40.node,local_40.position,paVar14);
    psVar1 = &(this->tree_).size_;
    *psVar1 = *psVar1 - 1;
    local_50.node = local_40.node;
    local_50.position = local_40.position;
    _Var10._M_head_impl =
         (this->tree_).root_.
         super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
         ._M_head_impl;
    local_58 = local_40.node;
    local_5c = local_40.position;
    if (_Var10._M_head_impl != local_40.node) {
      bVar7 = true;
      right_00 = local_40.node;
      uVar15 = local_40.position;
      do {
        if (((ulong)right_00 & 7) != 0) goto LAB_001c9bb8;
        if (0x1d < (byte)right_00[10]) goto LAB_001c9b4a;
        pbVar9 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   **)right_00;
        if ((ulong)(byte)right_00[8] == 0) {
          bVar6 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   )0x0;
LAB_001c993f:
          if (((ulong)pbVar9 & 7) != 0) goto LAB_001c9bb8;
          pbVar8 = right_00;
          if ((byte)bVar6 < (byte)pbVar9[10]) {
            right = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar9,(ulong)(byte)bVar6 + 1);
            if (((ulong)right & 7) != 0) goto LAB_001c9bb8;
            if ((right[0xb] !=
                 (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                  )0x0) &&
               (right[0xb] !=
                (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                 )0x3d)) {
              __assert_fail("right->max_count() == kNodeValues",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xbd0,
                            "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                           );
            }
            bVar6 = right_00[10];
            bVar3 = right[10];
            if ((uint)(byte)bVar6 + (uint)(byte)bVar3 + 1 < 0x3e) {
              btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::merge_nodes(&this->tree_,right_00,right);
              bVar5 = true;
              goto LAB_001c9a69;
            }
            if (((byte)bVar3 < 0x1f) ||
               ((bVar6 != (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                           )0x0 && ((int)uVar15 < 1)))) goto LAB_001c99d8;
            uVar12 = (int)(short)(((ushort)(byte)bVar3 - (ushort)(byte)bVar6) -
                                 ((short)((ushort)(byte)bVar3 - (ushort)(byte)bVar6) >> 0xf)) >> 1;
            uVar4 = (byte)bVar3 - 1;
            if ((int)uVar12 <= (int)((byte)bVar3 - 1)) {
              uVar4 = uVar12;
            }
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            ::rebalance_right_to_left(right_00,uVar4,right,(allocator_type *)(ulong)uVar12);
          }
          else {
LAB_001c99d8:
            if ((ulong)(byte)right_00[8] != 0) {
              pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                       ::child(pbVar9,(ulong)(byte)right_00[8] - 1);
              if (((ulong)pbVar9 & 7) != 0) goto LAB_001c9bb8;
              bVar6 = pbVar9[10];
              bVar5 = false;
              uVar11 = 0;
              if ((byte)bVar6 < 0x1f) goto LAB_001c9a69;
              bVar3 = right_00[10];
              if ((bVar3 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                             )0x0) ||
                 (uVar11 = (ushort)(byte)bVar3, (int)uVar15 < (int)(uint)(byte)bVar3)) {
                sVar13 = (byte)bVar6 - uVar11;
                uVar12 = (int)(short)(sVar13 - (sVar13 >> 0xf)) >> 1;
                uVar4 = (byte)bVar6 - 1;
                if ((int)uVar12 <= (int)((byte)bVar6 - 1)) {
                  uVar4 = uVar12;
                }
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::rebalance_left_to_right(pbVar9,uVar4,right_00,(allocator_type *)(ulong)uVar12);
                uVar15 = uVar15 + uVar4;
              }
            }
          }
          bVar5 = false;
        }
        else {
          pbVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   ::child(pbVar9,(ulong)(byte)right_00[8] - 1);
          if (((ulong)pbVar8 & 7) != 0) goto LAB_001c9bb8;
          if ((pbVar8[0xb] !=
               (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                )0x0) &&
             (pbVar8[0xb] !=
              (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               )0x3d)) {
            __assert_fail("left->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xbc5,
                          "bool phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                         );
          }
          if (0x3d < (uint)(byte)right_00[10] + (uint)(byte)pbVar8[10] + 1) {
            bVar6 = right_00[8];
            goto LAB_001c993f;
          }
          uVar15 = (byte)pbVar8[10] + 1 + uVar15;
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::merge_nodes(&this->tree_,pbVar8,right_00);
          bVar5 = true;
        }
LAB_001c9a69:
        if (bVar7) {
          local_5c = uVar15;
          local_58 = pbVar8;
          local_50.node = pbVar8;
          local_50.position = uVar15;
        }
        if (!bVar5) goto LAB_001c9b4a;
        uVar15 = (uint)(byte)pbVar8[8];
        right_00 = *(node_type **)pbVar8;
        _Var10._M_head_impl =
             (this->tree_).root_.
             super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
             ._M_head_impl;
        bVar7 = false;
      } while (right_00 != _Var10._M_head_impl);
    }
    if (((ulong)_Var10._M_head_impl & 7) == 0) {
      if (_Var10._M_head_impl[10] == (node_type)0x0) {
        if (_Var10._M_head_impl[0xb] == (node_type)0x0) {
          paVar14 = (allocator_type *)0x0;
          _Var10._M_head_impl =
               btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               ::child(_Var10._M_head_impl,0);
          if (((ulong)_Var10._M_head_impl & 7) == 0) {
            bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    ::is_root(*_Var10._M_head_impl);
            if (!bVar7) {
              __assert_fail("parent()->is_root()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x4ad,
                            "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::make_root() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                           );
            }
            if (((ulong)*(undefined8 **)_Var10._M_head_impl & 7) == 0) {
              *(undefined8 *)_Var10._M_head_impl = **(undefined8 **)_Var10._M_head_impl;
              this_00._M_head_impl =
                   (this->tree_).root_.
                   super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
                   ._M_head_impl;
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              ::destroy(this_00._M_head_impl,paVar14);
              operator_delete(this_00._M_head_impl,0x2f0);
              (this->tree_).root_.
              super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
              ._M_head_impl = _Var10._M_head_impl;
              goto LAB_001c9b43;
            }
          }
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_001c9bcd;
        }
        if ((this->tree_).size_ != 0) {
          __assert_fail("size() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xbfc,
                        "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::try_shrink() [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>]"
                       );
        }
        btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
        ::delete_leaf_node(&this->tree_,_Var10._M_head_impl);
        (this->tree_).root_.
        super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
              *)&btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
                 ::EmptyNode()::empty_node;
        (this->tree_).rightmost_ =
             (node_type *)
             &btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
              ::EmptyNode()::empty_node;
      }
LAB_001c9b43:
      if ((this->tree_).size_ == 0) {
        local_58 = (this->tree_).rightmost_;
        if (((ulong)local_58 & 7) == 0) {
          local_5c = (uint)(byte)local_58[10];
          goto LAB_001c9b80;
        }
      }
      else {
LAB_001c9b4a:
        if (((ulong)local_58 & 7) == 0) {
          if (local_5c == (byte)local_58[10]) {
            local_50.position = local_5c - 1;
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
            ::operator++(&local_50);
            local_58 = local_50.node;
            local_5c = local_50.position;
          }
LAB_001c9b80:
          if (bVar2 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                        )0x0) {
            local_50.node = local_58;
            local_50.position = local_5c;
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
            ::operator++(&local_50);
            local_58 = local_50.node;
            local_5c = local_50.position;
          }
          iVar16.position = local_5c;
          iVar16.node = local_58;
          iVar16._12_4_ = 0;
          return iVar16;
        }
      }
    }
  }
LAB_001c9bb8:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001c9bcd:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

iterator erase(iterator iter)       { return tree_.erase(iter); }